

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O0

mode_set * __thiscall ev3dev::dc_motor::commands_abi_cxx11_(dc_motor *this)

{
  mode_set *in_RDI;
  string *in_stack_00000098;
  string *in_stack_000000a0;
  device *in_stack_000000a8;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"commands",&local_31);
  device::get_attr_set(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

mode_set commands() const { return get_attr_set("commands"); }